

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O1

int cvHin(CVodeMem cv_mem,sunrealtype tout)

{
  N_Vector p_Var1;
  N_Vector p_Var2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Dd_00;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 local_a8 [16];
  double local_78;
  undefined8 uStack_50;
  double local_40;
  
  dVar6 = tout - cv_mem->cv_tn;
  iVar10 = -0x1b;
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    return -0x1b;
  }
  dVar7 = ABS(cv_mem->cv_tn);
  if (dVar7 <= ABS(tout)) {
    dVar7 = ABS(tout);
  }
  dVar7 = dVar7 * cv_mem->cv_uround;
  if (dVar7 + dVar7 <= ABS(dVar6)) {
    dVar7 = dVar7 * 100.0;
    p_Var1 = cv_mem->cv_tempv;
    p_Var2 = cv_mem->cv_acor;
    N_VAbs(cv_mem->cv_zn[0],p_Var2);
    (*cv_mem->cv_efun)(cv_mem->cv_zn[0],p_Var1,cv_mem->cv_e_data);
    N_VInv(p_Var1,p_Var1);
    N_VLinearSum(0x9999999a,0x3ff0000000000000,p_Var2,p_Var1,p_Var1);
    N_VAbs(cv_mem->cv_zn[1],p_Var2);
    N_VDiv(p_Var2,p_Var1,p_Var1);
    dVar12 = (double)N_VMaxNorm(p_Var1);
    dVar17 = ABS(dVar6) * 0.1;
    uVar11 = -(ulong)(1.0 < dVar17 * dVar12);
    dVar12 = (double)(~uVar11 & (ulong)dVar17 | (ulong)(1.0 / dVar12) & uVar11);
    dVar17 = dVar12 * dVar7;
    local_a8 = ZEXT816(0);
    if (0.0 < dVar17) {
      if (dVar17 < 0.0) {
        dVar17 = sqrt(dVar17);
        local_a8._12_4_ = extraout_XMM0_Dd;
        local_a8._8_4_ = extraout_XMM0_Dc;
        local_a8._0_8_ = dVar17;
      }
      else {
        local_a8._0_8_ = SQRT(dVar17);
        local_a8._8_8_ = 0;
      }
    }
    dVar17 = local_a8._0_8_;
    if (dVar7 <= dVar12) {
      uVar9 = 1;
      uVar13 = local_a8._8_4_;
      uVar14 = local_a8._12_4_;
      while( true ) {
        iVar10 = 4;
        while( true ) {
          auVar5._8_4_ = uVar13;
          auVar5._0_8_ = dVar17;
          auVar5._12_4_ = uVar14;
          auVar16._0_8_ = ~-(ulong)(dVar6 <= 0.0) & (ulong)dVar17;
          auVar16._12_4_ = uVar14;
          auVar16._8_4_ = uVar13;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (ulong)-dVar17 & -(ulong)(dVar6 <= 0.0);
          N_VLinearSum(SUB164(auVar16 | auVar3,0),0x3ff0000000000000,cv_mem->cv_zn[1],
                       cv_mem->cv_zn[0],cv_mem->cv_y);
          local_78 = SUB168(auVar16 | auVar3,0);
          iVar8 = (*cv_mem->cv_f)(cv_mem->cv_tn + local_78,cv_mem->cv_y,cv_mem->cv_tempv,
                                  cv_mem->cv_user_data);
          cv_mem->cv_nfe = cv_mem->cv_nfe + 1;
          if (iVar8 == 0) {
            N_VLinearSum(SUB84(1.0 / local_78,0),-1.0 / local_78,cv_mem->cv_tempv,cv_mem->cv_zn[1],
                         cv_mem->cv_tempv);
            local_40 = (double)N_VWrmsNorm(cv_mem->cv_tempv,cv_mem->cv_ewt);
          }
          if (iVar8 < 0) {
            return -8;
          }
          if (iVar8 == 0) break;
          dVar17 = dVar17 * 0.2;
          iVar10 = iVar10 + -1;
          if (iVar10 == 0) {
            if (uVar9 < 3) {
              return -10;
            }
            goto LAB_0010e663;
          }
        }
        uStack_50 = auVar5._8_8_;
        if (dVar12 * local_40 * dVar12 <= 2.0) {
          dVar15 = dVar12 * dVar17;
        }
        else {
          dVar15 = 2.0 / local_40;
        }
        dVar4 = 0.0;
        uVar13 = 0;
        uVar14 = 0;
        if (0.0 < dVar15) {
          if (dVar15 < 0.0) {
            dVar4 = sqrt(dVar15);
            uVar13 = extraout_XMM0_Dc_00;
            uVar14 = extraout_XMM0_Dd_00;
          }
          else {
            uVar13 = 0;
            uVar14 = 0;
            dVar4 = SQRT(dVar15);
          }
        }
        local_a8._0_8_ = dVar4;
        if (((uVar9 == 4) || ((dVar15 = dVar4 / dVar17, 0.5 < dVar15 && (dVar15 < 2.0)))) ||
           ((1 < uVar9 && (local_a8._0_8_ = dVar17, 2.0 < dVar15)))) break;
        uVar9 = uVar9 + 1;
        local_a8._8_8_ = uStack_50;
        local_a8._0_8_ = dVar17;
        dVar17 = dVar4;
      }
LAB_0010e663:
      if (dVar7 <= (double)local_a8._0_8_ * 0.5) {
        dVar7 = (double)local_a8._0_8_ * 0.5;
      }
      if (dVar7 <= dVar12) {
        dVar12 = dVar7;
      }
      dVar17 = (double)(-(ulong)(dVar6 <= 0.0) & (ulong)-dVar12 |
                       ~-(ulong)(dVar6 <= 0.0) & (ulong)dVar12);
    }
    else if (dVar6 <= 0.0) {
      dVar17 = -dVar17;
    }
    cv_mem->cv_h = dVar17;
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

static int cvHin(CVodeMem cv_mem, sunrealtype tout)
{
  int retval, sign, count1, count2;
  sunrealtype tdiff, tdist, tround, hlb, hub;
  sunrealtype hg, hgs, hs, hnew, hrat, h0, yddnrm;
  sunbooleantype hgOK;

  /* If tout is too close to tn, give up */

  if ((tdiff = tout - cv_mem->cv_tn) == ZERO) { return (CV_TOO_CLOSE); }

  sign   = (tdiff > ZERO) ? 1 : -1;
  tdist  = SUNRabs(tdiff);
  tround = cv_mem->cv_uround * SUNMAX(SUNRabs(cv_mem->cv_tn), SUNRabs(tout));

  if (tdist < TWO * tround) { return (CV_TOO_CLOSE); }

  /*
     Set lower and upper bounds on h0, and take geometric mean
     as first trial value.
     Exit with this value if the bounds cross each other.
  */

  hlb = HLB_FACTOR * tround;
  hub = cvUpperBoundH0(cv_mem, tdist);

  hg = SUNRsqrt(hlb * hub);

  if (hub < hlb)
  {
    if (sign == -1) { cv_mem->cv_h = -hg; }
    else { cv_mem->cv_h = hg; }
    return (CV_SUCCESS);
  }

  /* Outer loop */

  hs = hg; /* safeguard against 'uninitialized variable' warning */

  for (count1 = 1; count1 <= MAX_ITERS; count1++)
  {
    /* Attempts to estimate ydd */

    hgOK = SUNFALSE;

    for (count2 = 1; count2 <= MAX_ITERS; count2++)
    {
      hgs    = hg * sign;
      retval = cvYddNorm(cv_mem, hgs, &yddnrm);
      /* If the RHS function failed unrecoverably, give up */
      if (retval < 0) { return (CV_RHSFUNC_FAIL); }
      /* If successful, we can use ydd */
      if (retval == CV_SUCCESS)
      {
        hgOK = SUNTRUE;
        break;
      }
      /* The RHS function failed recoverably; cut step size and test again */
      hg *= POINT2;
    }

    /* If the RHS function failed recoverably MAX_ITERS times */

    if (!hgOK)
    {
      /* Exit if this is the first or second pass. No recovery possible */
      if (count1 <= 2) { return (CV_REPTD_RHSFUNC_ERR); }
      /* We have a fall-back option. The value hs is a previous hnew which
         passed through f(). Use it and break */
      hnew = hs;
      break;
    }

    /* The proposed step size is feasible. Save it. */
    hs = hg;

    /* Propose new step size */
    hnew = (yddnrm * hub * hub > TWO) ? SUNRsqrt(TWO / yddnrm)
                                      : SUNRsqrt(hg * hub);

    /* If last pass, stop now with hnew */
    if (count1 == MAX_ITERS) { break; }

    hrat = hnew / hg;

    /* Accept hnew if it does not differ from hg by more than a factor of 2 */
    if ((hrat > HALF) && (hrat < TWO)) { break; }

    /* After one pass, if ydd seems to be bad, use fall-back value. */
    if ((count1 > 1) && (hrat > TWO))
    {
      hnew = hg;
      break;
    }

    /* Send this value back through f() */
    hg = hnew;
  }

  /* Apply bounds, bias factor, and attach sign */

  h0 = H_BIAS * hnew;
  if (h0 < hlb) { h0 = hlb; }
  if (h0 > hub) { h0 = hub; }
  if (sign == -1) { h0 = -h0; }
  cv_mem->cv_h = h0;

  return (CV_SUCCESS);
}